

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<long_double>::Multiply
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *A,TPZFMatrix<long_double> *B,
          int opt)

{
  long lVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  ostream *poVar2;
  long lVar3;
  undefined8 in_R9;
  char local_29;
  
  lVar1 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  if (opt == 0) {
    lVar3 = (this->super_TPZBaseMatrix).fRow;
    if ((lVar1 == lVar3) &&
       ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol ==
        (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol)) goto LAB_00c4a806;
  }
  else {
    lVar3 = (this->super_TPZBaseMatrix).fCol;
    if ((lVar1 == lVar3) &&
       ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol ==
        (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol)) {
      if ((opt != 0) && ((this->super_TPZBaseMatrix).fDecomposed != '\0')) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "virtual void TPZMatrix<long double>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = long double]"
                   ,0x78);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "\nERROR: Cannot multiply with opt when matrix is decomposed",0x3a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\nAborting...\n",0xd);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
                   ,0x6c8);
      }
      goto LAB_00c4a806;
    }
  }
  (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (B,lVar3,(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
LAB_00c4a806:
  switch((this->super_TPZBaseMatrix).fDecomposed) {
  case '\0':
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
              (this,A,B,B,(ulong)(uint)opt,in_R9,(longdouble)1,(longdouble)0);
    return;
  case '\x01':
    TPZFMatrix<long_double>::operator=(B,A);
    UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x43];
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZMatrix<long double>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = long double]"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nERROR: Cannot multiply with fDecomposed:",0x29);
    local_29 = (this->super_TPZBaseMatrix).fDecomposed;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_29,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nAborting...\n",0xd);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
               ,0x6e2);
  case '\x03':
    TPZFMatrix<long_double>::operator=(B,A);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x44])(this,B);
    UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x45];
    break;
  case '\x04':
    TPZFMatrix<long_double>::operator=(B,A);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x46])(this,B);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x48])(this,B);
    UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x47];
  }
  (*UNRECOVERED_JUMPTABLE)(this,B);
  return;
}

Assistant:

void TPZMatrix<TVar>::Multiply(const TPZFMatrix<TVar> &A, TPZFMatrix<TVar>&B, int opt) const {
  
	
	if(!opt && (B.Rows() != Rows() || B.Cols() != A.Cols())) {
		B.Redim(Rows(),A.Cols());
	}
	else if (opt && (B.Rows() != Cols() || B.Cols() != A.Cols())) {
		B.Redim(Cols(),A.Cols());
	}else if(opt && this->fDecomposed){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with opt when matrix is decomposed"
           <<"\nAborting...\n";
    DebugStop();
  }
  
  switch(this->fDecomposed){
  case ENoDecompose:
    MultAdd( A, B, B, 1.0, 0.0, opt);
    break;
  case ELU:
    B=A;
    Substitution(&B);
    break;
  case ECholesky:
    B=A;
    Subst_Forward(&B);
    Subst_Backward(&B);
    break;
  case ELDLt:
    B=A;
    Subst_LForward(&B);
    Subst_Diag(&B);
    Subst_LBackward(&B);
    break;
  default:
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with fDecomposed:"<<fDecomposed
           <<"\nAborting...\n";
    DebugStop();
  }
	
}